

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O3

ActionResults * __thiscall AbstractRoomAction::Pick(AbstractRoomAction *this)

{
  ItemTable *pIVar1;
  bool bVar2;
  itemType iVar3;
  itemLocation iVar4;
  ItemWrapper *pIVar5;
  ActionResults *this_00;
  long *plVar6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string information;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 local_e0 [16];
  Item local_d0;
  string local_a8;
  itemType local_84;
  string local_80;
  string local_60;
  string local_40;
  
  local_e8 = (char *)0x0;
  local_e0[0] = 0;
  local_f0 = local_e0;
  iVar3 = Command::getMainItem(this->commands);
  bVar2 = itemInRoom(this,iVar3);
  if (bVar2) {
    pIVar1 = this->itemList;
    iVar3 = Command::getMainItem(this->commands);
    local_d0.name._M_dataplus._M_p._0_4_ = iVar3;
    pIVar5 = ItemTable::getValue(pIVar1,(itemType *)&local_d0);
    iVar4 = ItemWrapper::getLocation(pIVar5);
    if (iVar4 != BACKPACK) {
      iVar3 = Command::getMainItem(this->commands);
      if ((iVar3 < TOKEN_DOOR) && ((0x1600U >> (iVar3 & STAIRS) & 1) != 0)) {
        bVar2 = hasAToken(this);
        pcVar9 = "Only one token allowed to be picked up at a time.";
        if (!bVar2) {
          iVar3 = Command::getMainItem(this->commands);
          bVar2 = itemInRoom(this,iVar3);
          if (bVar2) {
            pIVar1 = this->itemList;
            local_84 = Command::getMainItem(this->commands);
            pIVar5 = ItemTable::getValue(pIVar1,&local_84);
            ItemWrapper::getItem(&local_d0,pIVar5);
            Item::getName_abi_cxx11_(&local_60,&local_d0);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x10a44a);
            psVar7 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_a8.field_2._M_allocated_capacity = *psVar7;
              local_a8.field_2._8_8_ = plVar6[3];
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            }
            else {
              local_a8.field_2._M_allocated_capacity = *psVar7;
              local_a8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_a8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(itemType)local_60._M_dataplus._M_p) !=
                &local_60.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                       (itemType)local_60._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
              operator_delete(local_d0.name._M_dataplus._M_p);
            }
            pIVar1 = this->itemList;
            iVar3 = Command::getMainItem(this->commands);
            local_d0.name._M_dataplus._M_p._0_4_ = iVar3;
            pIVar5 = ItemTable::getValue(pIVar1,(itemType *)&local_d0);
            ItemWrapper::setLocation(pIVar5,BACKPACK);
            goto LAB_001054c4;
          }
        }
LAB_001053c8:
        std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,(ulong)pcVar9);
      }
      else {
        iVar3 = Command::getMainItem(this->commands);
        bVar2 = itemInRoom(this,iVar3);
        if (!bVar2) {
          pcVar9 = "You cant pick up an item that is not here.";
          goto LAB_001053c8;
        }
        pIVar1 = this->itemList;
        iVar3 = Command::getMainItem(this->commands);
        local_d0.name._M_dataplus._M_p._0_4_ = iVar3;
        pIVar5 = ItemTable::getValue(pIVar1,(itemType *)&local_d0);
        ItemWrapper::setLocation(pIVar5,BACKPACK);
        pIVar1 = this->itemList;
        local_60._M_dataplus._M_p._0_4_ = Command::getMainItem(this->commands);
        pIVar5 = ItemTable::getValue(pIVar1,(itemType *)&local_60);
        ItemWrapper::getItemName_abi_cxx11_(&local_a8,pIVar5);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x10a491);
        paVar10 = &local_d0.name.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.name.field_2._M_allocated_capacity = *psVar7;
          local_d0.name.field_2._8_8_ = plVar6[3];
          local_d0.name._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_d0.name.field_2._M_allocated_capacity = *psVar7;
          local_d0.name._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0.name._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name._M_dataplus._M_p != paVar10) {
          operator_delete(local_d0.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
LAB_001054c4:
      this_00 = (ActionResults *)operator_new(0x30);
      paVar10 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_f0,local_e8 + (long)local_f0);
      ActionResults::ActionResults(this_00,CURRENT,&local_80);
      _Var8._M_p = local_80._M_dataplus._M_p;
      goto LAB_0010550b;
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,0x10a3f6);
  this_00 = (ActionResults *)operator_new(0x30);
  paVar10 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_f0,local_e8 + (long)local_f0);
  ActionResults::ActionResults(this_00,CURRENT,&local_40);
  _Var8._M_p = local_40._M_dataplus._M_p;
LAB_0010550b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p != paVar10) {
    operator_delete(_Var8._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return this_00;
}

Assistant:

ActionResults * AbstractRoomAction::Pick() {
    std::string information;

    if (!itemInRoom(commands->getMainItem()) ||
        itemList->getValue(commands->getMainItem())->getLocation()
        == BACKPACK) {
        information = "You can not pick up an item that is not in the room or is already in your backpack.";
        return new ActionResults(CURRENT, information);

    }

    switch (commands->getMainItem()) {
        case FOX_TOKEN :
        case GOOSE_TOKEN :
        case BEAN_TOKEN :
            if (!hasAToken() && itemInRoom(commands->getMainItem())) {
                information = "You pick up the the " +
                              itemList->getValue(commands->getMainItem())->getItem().getName();
                itemList->getValue(commands->getMainItem())->setLocation(BACKPACK);
            } else {
                information = "Only one token allowed to be picked up at a time.";
            }
            break;
        default:
            if (itemInRoom(commands->getMainItem())) {
                itemList->getValue(commands->getMainItem())->setLocation(BACKPACK);
                information = "You pick up the " + itemList->getValue(commands->getMainItem())->getItemName();
            } else {
                information = "You cant pick up an item that is not here.";
            }
            break;
    }

    return new ActionResults(CURRENT, information);
}